

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::ast::SFormat::formatRaw4(string *result,ConstantValue *value)

{
  bool bVar1;
  uint uVar2;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar3;
  uint64_t uVar4;
  ConstantValue *value_00;
  uint uVar5;
  ConstantValue *elem;
  uint uVar6;
  uint32_t i;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar7;
  uint64_t uVar8;
  long lVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar10;
  span<const_slang::ConstantValue,_18446744073709551615UL> sVar11;
  anon_class_8_1_6971b95b writeEntry;
  anon_class_8_1_6971b95b local_48;
  ulong local_40;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *local_38;
  
  if (*(__index_type *)
       ((long)&(value->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) == '\x05') {
    sVar11 = ConstantValue::elements(value);
    value_00 = sVar11._M_ptr;
    for (lVar9 = sVar11._M_extent._M_extent_value._M_extent_value * 0x28; lVar9 != 0;
        lVar9 = lVar9 + -0x28) {
      formatRaw4(result,value_00);
      value_00 = value_00 + 1;
    }
  }
  else {
    local_38 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         (&value->value);
    uVar2 = (local_38->super_SVIntStorage).bitWidth;
    bVar1 = (local_38->super_SVIntStorage).unknownFlag;
    uVar6 = (uVar2 + 0x3f >> 6) << (bVar1 & 0x1fU);
    pvVar3 = (variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
              *)(local_38->super_SVIntStorage).field_0.val;
    uVar5 = uVar6 >> 1;
    if (bVar1 != false) {
      uVar6 = uVar5;
      local_38 = pvVar3;
    }
    if (0x40 < uVar2) {
      local_38 = pvVar3;
    }
    paVar7 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0;
    paVar10 = &(local_38->super_SVIntStorage).field_0 + uVar5;
    if (bVar1 == false) {
      paVar10 = paVar7;
    }
    local_40 = (ulong)((uVar2 & 0x3f) - 0x21);
    local_48.result = result;
    for (; (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(ulong)uVar6 != paVar7;
        paVar7 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)((long)paVar7 + 1)) {
      if (paVar10 == (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = paVar10[(long)paVar7].val;
      }
      uVar4 = (&(local_38->super_SVIntStorage).field_0)[(long)paVar7].val;
      formatRaw4::anon_class_8_1_6971b95b::operator()(&local_48,(uint32_t)uVar4,(uint32_t)uVar8);
      if (((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(ulong)(uVar6 - 1) != paVar7) ||
         ((uint)local_40 < 0xffffffe0)) {
        formatRaw4::anon_class_8_1_6971b95b::operator()
                  (&local_48,(uint32_t)(uVar4 >> 0x20),(uint32_t)(uVar8 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

static void formatRaw4(std::string& result, const ConstantValue& value) {
    if (value.isUnpacked()) {
        for (auto& elem : value.elements())
            formatRaw4(result, elem);
        return;
    }

    const SVInt& sv = value.integer();
    uint32_t words = sv.getNumWords();
    const uint64_t* ptr = sv.getRawPtr();
    const uint64_t* unknownPtr = nullptr;
    if (sv.hasUnknown()) {
        words /= 2;
        unknownPtr = ptr + words;
    }

    uint32_t lastBits = sv.getBitWidth() % 64;
    if (lastBits == 0)
        lastBits = 64;

    auto writeEntry = [&result](uint32_t bits, uint32_t unknowns) {
        // The encoding for X and Z are reversed from how SVInt stores them.
        s_vpi_vecval entry;
        entry.aval = bits ^ unknowns;
        entry.bval = unknowns;
        result.append(reinterpret_cast<const char*>(&entry), sizeof(s_vpi_vecval));
    };

    for (uint32_t i = 0; i < words; i++) {
        uint64_t bits = ptr[i];
        uint64_t unknowns = unknownPtr ? unknownPtr[i] : 0;

        writeEntry(uint32_t(bits), uint32_t(unknowns));

        // Don't write the upper half of the last word if we don't actually have those bits.
        if (i != words - 1 || lastBits > 32)
            writeEntry(uint32_t(bits >> 32), uint32_t(unknowns >> 32));
    }
}